

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphElements.cpp
# Opt level: O3

int __thiscall
dg::vr::VRLocation::connect(VRLocation *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  undefined8 uVar1;
  int extraout_EAX;
  sockaddr *__addr_00;
  undefined4 in_register_00000034;
  __uniq_ptr_impl<dg::vr::VREdge,_std::default_delete<dg::vr::VREdge>_> local_20;
  
  local_20._M_t.super__Tuple_impl<0UL,_dg::vr::VREdge_*,_std::default_delete<dg::vr::VREdge>_>.
  super__Head_base<0UL,_dg::vr::VREdge_*,_false>._M_head_impl =
       (tuple<dg::vr::VREdge_*,_std::default_delete<dg::vr::VREdge>_>)operator_new(0x20);
  *(VRLocation **)
   local_20._M_t.super__Tuple_impl<0UL,_dg::vr::VREdge_*,_std::default_delete<dg::vr::VREdge>_>.
   super__Head_base<0UL,_dg::vr::VREdge_*,_false>._M_head_impl = this;
  *(ulong *)((long)local_20._M_t.
                   super__Tuple_impl<0UL,_dg::vr::VREdge_*,_std::default_delete<dg::vr::VREdge>_>.
                   super__Head_base<0UL,_dg::vr::VREdge_*,_false>._M_head_impl + 8) =
       CONCAT44(in_register_00000034,__fd);
  uVar1._0_2_ = __addr->sa_family;
  uVar1._2_1_ = __addr->sa_data[0];
  uVar1._3_1_ = __addr->sa_data[1];
  uVar1._4_1_ = __addr->sa_data[2];
  uVar1._5_1_ = __addr->sa_data[3];
  uVar1._6_1_ = __addr->sa_data[4];
  uVar1._7_1_ = __addr->sa_data[5];
  *(undefined8 *)
   ((long)local_20._M_t.
          super__Tuple_impl<0UL,_dg::vr::VREdge_*,_std::default_delete<dg::vr::VREdge>_>.
          super__Head_base<0UL,_dg::vr::VREdge_*,_false>._M_head_impl + 0x10) = uVar1;
  __addr->sa_family = 0;
  __addr->sa_data[0] = '\0';
  __addr->sa_data[1] = '\0';
  __addr->sa_data[2] = '\0';
  __addr->sa_data[3] = '\0';
  __addr->sa_data[4] = '\0';
  __addr->sa_data[5] = '\0';
  *(undefined4 *)
   ((long)local_20._M_t.
          super__Tuple_impl<0UL,_dg::vr::VREdge_*,_std::default_delete<dg::vr::VREdge>_>.
          super__Head_base<0UL,_dg::vr::VREdge_*,_false>._M_head_impl + 0x18) = 3;
  connect(this,(int)&local_20,__addr_00,(socklen_t)uVar1);
  std::unique_ptr<dg::vr::VREdge,_std::default_delete<dg::vr::VREdge>_>::~unique_ptr
            ((unique_ptr<dg::vr::VREdge,_std::default_delete<dg::vr::VREdge>_> *)&local_20);
  return extraout_EAX;
}

Assistant:

void VRLocation::connect(VRLocation *target, std::unique_ptr<VROp> &&op) {
    connect(std::unique_ptr<VREdge>(new VREdge(this, target, std::move(op))));
}